

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeStamp.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::TimeStamp::CalculateTimeStamp(TimeStamp *this)

{
  undefined1 local_38 [8];
  timespec ts;
  tm *newtime;
  time_t aclock;
  TimeStamp *pTStack_10;
  KINT32 iTs;
  TimeStamp *this_local;
  
  aclock._4_4_ = 0;
  pTStack_10 = this;
  time((time_t *)&newtime);
  ts.tv_nsec = (__syscall_slong_t)localtime((time_t *)&newtime);
  aclock._4_4_ = (int)((double)(((tm *)ts.tv_nsec)->tm_sec + ((tm *)ts.tv_nsec)->tm_min * 0x3c) /
                      1.67638e-06);
  clock_gettime(0,(timespec *)local_38);
  (this->m_TimeStampUnion).m_ui32TimeStamp =
       (this->m_TimeStampUnion).m_ui32TimeStamp & 1 |
       (int)((double)aclock._4_4_ + (double)ts.tv_sec / 1676.38) << 1;
  return;
}

Assistant:

void TimeStamp::CalculateTimeStamp()
{
    // Calculate the time by taking the minutes, seconds and milliseconds(if supported by os) since the hour and dividing them by 0.000001676
    KINT32 iTs = 0;

#if defined( WIN32 ) | defined( WIN64 ) // Microsoft Windows

    SYSTEMTIME now;
    GetSystemTime( &now );
    KFLOAT64 f = ( now.wMinute * 60 ) + now.wSecond + ( now.wMilliseconds / 1000.0 );
    iTs = f / 0.00000167638;

#else

    time_t aclock;
    time( &aclock );
    struct tm * newtime = localtime( &aclock );
    iTs = newtime->tm_sec + ( newtime->tm_min * 60 );
    iTs = iTs / 0.00000167638;

#endif

#if defined( linux ) // Linux -- Note: You need to include the rt library for clock_gettime.

    // Add nano seconds
    timespec ts;
    clock_gettime( 0, &ts );
    iTs += ts.tv_nsec / 1676.38;

#endif

    m_TimeStampUnion.m_ui32Time = iTs;
}